

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilter.cpp
# Opt level: O0

void __thiscall
UnscentedKalmanFilter_computeSigmaPoints_Test::TestBody
          (UnscentedKalmanFilter_computeSigmaPoints_Test *this)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *this_00;
  char *pcVar2;
  Scalar *pSVar3;
  char *in_R9;
  AssertHelper local_290;
  Message local_288;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_8;
  Message local_268;
  undefined1 local_260 [8];
  AssertionResult gtest_ar_7;
  Message local_248;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_6;
  Message local_228;
  undefined1 local_220 [8];
  AssertionResult gtest_ar_5;
  Message local_208;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_4;
  Message local_1e8;
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_3;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_2;
  Message local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_1;
  Message local_188;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  string local_168;
  AssertHelper local_148;
  Message local_140;
  undefined1 local_138 [8];
  AssertionResult gtest_ar_;
  Scalar local_118;
  Scalar local_114;
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> local_110;
  undefined1 local_ec [8];
  UnscentedKalmanFilter<Kalman::Vector<float,_3>_> ukf;
  T kappa;
  T beta;
  T alpha;
  UnscentedKalmanFilter_computeSigmaPoints_Test *this_local;
  
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8] = 2.0;
  ukf.super_StandardFilterBase<Kalman::Vector<float,_3>_>.
  super_StandardBase<Kalman::Vector<float,_3>_>.P.
  super_PlainObjectBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[7] = 1.0;
  Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::UnscentedKalmanFilter
            ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_ec,1.0,2.0,1.0);
  ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.beta = 2.0;
  local_114 = 1.0;
  Eigen::DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator<<
            (&local_110,(DenseBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)local_ec,&local_114);
  local_118 = 2.0;
  this_00 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                      (&local_110,&local_118);
  gtest_ar_.message_.ptr_._0_4_ = 0x40400000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
            (this_00,(Scalar *)&gtest_ar_.message_);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_110);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_>::setIdentity
            ((MatrixBase<Eigen::Matrix<float,_3,_3,_0,_3,_3>_> *)
             &ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.gamma);
  bVar1 = Kalman::UnscentedKalmanFilter<Kalman::Vector<float,_3>_>::computeSigmaPoints
                    ((UnscentedKalmanFilter<Kalman::Vector<float,_3>_> *)local_ec);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_138,bVar1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_140);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_168,(internal *)local_138,(AssertionResult *)"ukf.computeSigmaPoints()",
               "false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
               ,0x1f,pcVar2);
    testing::internal::AssertHelper::operator=(&local_148,&local_140);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    testing::Message::~Message(&local_140);
  }
  gtest_ar.message_.ptr_._5_3_ = 0;
  gtest_ar.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  if (gtest_ar.message_.ptr_._4_4_ == 0) {
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1> *)
                        ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                sigmaWeights_c.super_Matrix<float,_7,_1>.
                                super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                m_storage.m_data + 0x14),0,0);
    testing::internal::CmpHelperFloatingPointEQ<float>
              ((internal *)local_180,"1","ukf.sigmaStatePoints(0,0)",1.0,*pSVar3);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
    if (!bVar1) {
      testing::Message::Message(&local_188);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                 ,0x21,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_188);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_188);
    }
    gtest_ar.message_.ptr_._5_3_ = 0;
    gtest_ar.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
    if (gtest_ar.message_.ptr_._4_4_ == 0) {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1>::operator()
                         ((DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1> *)
                          ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                  sigmaWeights_c.super_Matrix<float,_7,_1>.
                                  super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                  m_storage.m_data + 0x14),1,0);
      testing::internal::CmpHelperFloatingPointEQ<float>
                ((internal *)local_1a0,"2","ukf.sigmaStatePoints(1,0)",2.0,*pSVar3);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
      if (!bVar1) {
        testing::Message::Message(&local_1a8);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                   ,0x22,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1a8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_1a8);
      }
      gtest_ar.message_.ptr_._5_3_ = 0;
      gtest_ar.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
      if (gtest_ar.message_.ptr_._4_4_ == 0) {
        pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1> *)
                            ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                    sigmaWeights_c.super_Matrix<float,_7,_1>.
                                    super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                    m_storage.m_data + 0x14),2,0);
        testing::internal::CmpHelperFloatingPointEQ<float>
                  ((internal *)local_1c0,"3","ukf.sigmaStatePoints(2,0)",3.0,*pSVar3);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
        if (!bVar1) {
          testing::Message::Message(&local_1c8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                     ,0x23,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_3.message_,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
          testing::Message::~Message(&local_1c8);
        }
        gtest_ar.message_.ptr_._5_3_ = 0;
        gtest_ar.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
        if (gtest_ar.message_.ptr_._4_4_ == 0) {
          pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1>::operator()
                             ((DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1> *)
                              ((long)&ukf.super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>
                                      .sigmaWeights_c.super_Matrix<float,_7,_1>.
                                      super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                      m_storage.m_data + 0x14),0,1);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_1e0,"3","ukf.sigmaStatePoints(0,1)",3.0,*pSVar3);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
          if (!bVar1) {
            testing::Message::Message(&local_1e8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                       ,0x26,pcVar2);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_4.message_,&local_1e8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
            testing::Message::~Message(&local_1e8);
          }
          gtest_ar.message_.ptr_._5_3_ = 0;
          gtest_ar.message_.ptr_._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
          if (gtest_ar.message_.ptr_._4_4_ == 0) {
            pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1>::operator()
                               ((DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1> *)
                                ((long)&ukf.
                                        super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>.
                                        sigmaWeights_c.super_Matrix<float,_7,_1>.
                                        super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>.
                                        m_storage.m_data + 0x14),1,2);
            testing::internal::CmpHelperFloatingPointEQ<float>
                      ((internal *)local_200,"4","ukf.sigmaStatePoints(1,2)",4.0,*pSVar3);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
            if (!bVar1) {
              testing::Message::Message(&local_208);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                         ,0x27,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_5.message_,&local_208);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
              testing::Message::~Message(&local_208);
            }
            gtest_ar.message_.ptr_._5_3_ = 0;
            gtest_ar.message_.ptr_._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
            if (gtest_ar.message_.ptr_._4_4_ == 0) {
              pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1>::operator()
                                 ((DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1> *)
                                  ((long)&ukf.
                                          super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>
                                          .sigmaWeights_c.super_Matrix<float,_7,_1>.
                                          super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>
                                          .m_storage.m_data + 0x14),2,3);
              testing::internal::CmpHelperFloatingPointEQ<float>
                        ((internal *)local_220,"5","ukf.sigmaStatePoints(2,3)",5.0,*pSVar3);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_220);
              if (!bVar1) {
                testing::Message::Message(&local_228);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_220);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                           ,0x28,pcVar2);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_6.message_,&local_228);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_)
                ;
                testing::Message::~Message(&local_228);
              }
              gtest_ar.message_.ptr_._5_3_ = 0;
              gtest_ar.message_.ptr_._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_220);
              if (gtest_ar.message_.ptr_._4_4_ == 0) {
                pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1>::operator()
                                   ((DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1> *)
                                    ((long)&ukf.
                                            super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>
                                            .sigmaWeights_c.super_Matrix<float,_7,_1>.
                                            super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>
                                            .m_storage.m_data + 0x14),0,4);
                testing::internal::CmpHelperFloatingPointEQ<float>
                          ((internal *)local_240,"-1","ukf.sigmaStatePoints(0,4)",-1.0,*pSVar3);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_240);
                if (!bVar1) {
                  testing::Message::Message(&local_248);
                  pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                             ,0x2b,pcVar2);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_7.message_,&local_248);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_7.message_);
                  testing::Message::~Message(&local_248);
                }
                gtest_ar.message_.ptr_._5_3_ = 0;
                gtest_ar.message_.ptr_._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
                if (gtest_ar.message_.ptr_._4_4_ == 0) {
                  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1>::
                           operator()((DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1> *)
                                      ((long)&ukf.
                                              super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>
                                              .sigmaWeights_c.super_Matrix<float,_7,_1>.
                                              super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>
                                              .m_storage.m_data + 0x14),1,5);
                  testing::internal::CmpHelperFloatingPointEQ<float>
                            ((internal *)local_260,"0","ukf.sigmaStatePoints(1,5)",0.0,*pSVar3);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_260);
                  if (!bVar1) {
                    testing::Message::Message(&local_268);
                    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_260)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                               ,0x2c,pcVar2);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_8.message_,&local_268);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_8.message_);
                    testing::Message::~Message(&local_268);
                  }
                  gtest_ar.message_.ptr_._5_3_ = 0;
                  gtest_ar.message_.ptr_._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_260);
                  if (gtest_ar.message_.ptr_._4_4_ == 0) {
                    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1>::
                             operator()((DenseCoeffsBase<Eigen::Matrix<float,_3,_7,_0,_3,_7>,_1> *)
                                        ((long)&ukf.
                                                super_UnscentedKalmanFilterBase<Kalman::Vector<float,_3>_>
                                                .sigmaWeights_c.super_Matrix<float,_7,_1>.
                                                super_PlainObjectBase<Eigen::Matrix<float,_7,_1,_0,_7,_1>_>
                                                .m_storage.m_data + 0x14),2,6);
                    testing::internal::CmpHelperFloatingPointEQ<float>
                              ((internal *)local_280,"1","ukf.sigmaStatePoints(2,6)",1.0,*pSVar3);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_280);
                    if (!bVar1) {
                      testing::Message::Message(&local_288);
                      pcVar2 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_280);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_290,kFatalFailure,
                                 "/workspace/llm4binary/github/license_c_cmakelists/jwdinius[P]kalman/test/UnscentedKalmanFilter.cpp"
                                 ,0x2d,pcVar2);
                      testing::internal::AssertHelper::operator=(&local_290,&local_288);
                      testing::internal::AssertHelper::~AssertHelper(&local_290);
                      testing::Message::~Message(&local_288);
                    }
                    gtest_ar.message_.ptr_._5_3_ = 0;
                    gtest_ar.message_.ptr_._4_1_ = !bVar1;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(UnscentedKalmanFilter, computeSigmaPoints) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = UnscentedKalmanFilter<Vector<T, 3>>(alpha,beta,kappa);
    
    // Init variables
    ukf.gamma = 2;
    ukf.x << 1.f, 2.f, 3.f;
    ukf.P.setIdentity();
    
    ASSERT_TRUE(ukf.computeSigmaPoints());
    
    ASSERT_FLOAT_EQ(1, ukf.sigmaStatePoints(0,0));
    ASSERT_FLOAT_EQ(2, ukf.sigmaStatePoints(1,0));
    ASSERT_FLOAT_EQ(3, ukf.sigmaStatePoints(2,0));
    
    // Center block diagonal
    ASSERT_FLOAT_EQ(3, ukf.sigmaStatePoints(0,1));
    ASSERT_FLOAT_EQ(4, ukf.sigmaStatePoints(1,2));
    ASSERT_FLOAT_EQ(5, ukf.sigmaStatePoints(2,3));
    
    // Right block diagonal
    ASSERT_FLOAT_EQ(-1, ukf.sigmaStatePoints(0,4));
    ASSERT_FLOAT_EQ(0,  ukf.sigmaStatePoints(1,5));
    ASSERT_FLOAT_EQ(1,  ukf.sigmaStatePoints(2,6));
}